

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O0

utf8proc_ssize_t
seqindex_write_char_decomposed
          (utf8proc_uint16_t seqindex,utf8proc_int32_t *dst,utf8proc_ssize_t bufsize,
          utf8proc_option_t options,int *last_boundclass)

{
  utf8proc_int32_t uc;
  utf8proc_ssize_t uVar1;
  utf8proc_ssize_t local_68;
  uint local_4c;
  utf8proc_int32_t entry_cp;
  int len;
  utf8proc_uint16_t *entry;
  utf8proc_ssize_t written;
  int *last_boundclass_local;
  utf8proc_ssize_t uStack_28;
  utf8proc_option_t options_local;
  utf8proc_ssize_t bufsize_local;
  utf8proc_int32_t *dst_local;
  utf8proc_uint16_t seqindex_local;
  
  entry = (utf8proc_uint16_t *)0x0;
  _entry_cp = utf8proc_sequences + (int)(seqindex & 0x1fff);
  local_4c = (int)(uint)seqindex >> 0xd;
  written = (utf8proc_ssize_t)last_boundclass;
  last_boundclass_local._4_4_ = options;
  uStack_28 = bufsize;
  bufsize_local = (utf8proc_ssize_t)dst;
  dst_local._6_2_ = seqindex;
  if (6 < local_4c) {
    local_4c = (uint)*_entry_cp;
    _entry_cp = utf8proc_sequences + (long)(int)(seqindex & 0x1fff) + 1;
  }
  while( true ) {
    if ((int)local_4c < 0) {
      return (utf8proc_ssize_t)entry;
    }
    uc = seqindex_decode_entry((utf8proc_uint16_t **)&entry_cp);
    if ((long)entry < uStack_28) {
      local_68 = uStack_28 - (long)entry;
    }
    else {
      local_68 = 0;
    }
    uVar1 = utf8proc_decompose_char
                      (uc,(utf8proc_int32_t *)(bufsize_local + (long)entry * 4),local_68,
                       last_boundclass_local._4_4_,(int *)written);
    entry = (utf8proc_uint16_t *)(uVar1 + (long)entry);
    if ((long)entry < 0) break;
    _entry_cp = _entry_cp + 1;
    local_4c = local_4c - 1;
  }
  return -2;
}

Assistant:

static utf8proc_ssize_t seqindex_write_char_decomposed(utf8proc_uint16_t seqindex, utf8proc_int32_t *dst, utf8proc_ssize_t bufsize, utf8proc_option_t options, int *last_boundclass) {
  utf8proc_ssize_t written = 0;
  const utf8proc_uint16_t *entry = &utf8proc_sequences[seqindex & 0x1FFF];
  int len = seqindex >> 13;
  if (len >= 7) {
    len = *entry;
    entry++;
  }
  for (; len >= 0; entry++, len--) {
    utf8proc_int32_t entry_cp = seqindex_decode_entry(&entry);

    written += utf8proc_decompose_char(entry_cp, dst+written,
      (bufsize > written) ? (bufsize - written) : 0, options,
    last_boundclass);
    if (written < 0) return UTF8PROC_ERROR_OVERFLOW;
  }
  return written;
}